

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode
JsVarDeserializerSetTransferableVars
          (JsVarDeserializerHandle deserializerHandle,JsValueRef *transferableVars,
          size_t transferableVarsCount)

{
  anon_class_24_3_fd76b34f fn;
  size_t local_28;
  size_t transferableVarsCount_local;
  JsValueRef *transferableVars_local;
  JsVarDeserializerHandle deserializerHandle_local;
  
  if (deserializerHandle == (JsVarDeserializerHandle)0x0) {
    deserializerHandle_local._4_4_ = JsErrorNullArgument;
  }
  else {
    fn.transferableVars = (JsValueRef **)&transferableVarsCount_local;
    fn.deserializerHandle = &transferableVars_local;
    fn.transferableVarsCount = &local_28;
    local_28 = transferableVarsCount;
    transferableVarsCount_local = (size_t)transferableVars;
    transferableVars_local = (JsValueRef *)deserializerHandle;
    deserializerHandle_local._4_4_ =
         ContextAPINoScriptWrapper_NoRecord<JsVarDeserializerSetTransferableVars::__0>
                   (fn,false,false);
  }
  return deserializerHandle_local._4_4_;
}

Assistant:

CHAKRA_API
JsVarDeserializerSetTransferableVars(_In_ JsVarDeserializerHandle deserializerHandle, _In_opt_ JsValueRef *transferableVars, _In_ size_t transferableVarsCount)
{
    PARAM_NOT_NULL(deserializerHandle);
    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        ChakraHostDeserializerHandle* deserializer = reinterpret_cast<ChakraHostDeserializerHandle*>(deserializerHandle);
        return deserializer->SetTransferableVars(transferableVars, transferableVarsCount);
    });
}